

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

bool CaptureSummary::CaptureLineIsLower(CaptureLine *x,CaptureLine *y)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = x->registry_name[0];
  bVar5 = y->registry_name[0];
  if (bVar4 != 0 && bVar4 == bVar5) {
    lVar3 = 1;
    do {
      bVar4 = x->registry_name[lVar3];
      bVar5 = y->registry_name[lVar3];
      if (bVar4 == 0) break;
      lVar3 = lVar3 + 1;
    } while (bVar4 == bVar5);
  }
  bVar2 = true;
  if (bVar5 <= bVar4) {
    if (bVar4 <= bVar5) {
      iVar1 = x->key_type;
      if (iVar1 < y->key_type) {
        return true;
      }
      if (iVar1 == y->key_type) {
        if (iVar1 == 0) {
          return (x->field_2).key_number < (y->field_2).key_number;
        }
        bVar4 = (x->field_2).key_value[0];
        bVar5 = (y->field_2).key_value[0];
        if (bVar4 != 0 && bVar4 == bVar5) {
          lVar3 = 0x45;
          do {
            bVar4 = x->registry_name[lVar3];
            bVar5 = y->registry_name[lVar3];
            if (bVar4 == 0) break;
            lVar3 = lVar3 + 1;
          } while (bVar4 == bVar5);
        }
        return bVar4 < bVar5;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

int CaptureSummary::compare_string(char const * x, char const * y)
{
    int ret = 0;
    uint8_t ux, uy;

    while (*x == *y && *x != 0)
    {
        x++;
        y++;
    }

    ux = (uint8_t)*x;
    uy = (uint8_t)*y;

    if (ux < uy)
    {
        ret = 1;
    }
    else if (ux > uy)
    {
        ret = -1;
    }

    return ret;
}